

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_nameMatchesAscii(ENCODING *UNUSED_enc,char *ptr1,char *end1,char *ptr2)

{
  long lVar1;
  
  lVar1 = (long)end1 - (long)ptr1;
  while( true ) {
    if (*ptr2 == '\0') {
      return (uint)(ptr1 == end1);
    }
    if (lVar1 < 1) break;
    if (*ptr1 != *ptr2) {
      return 0;
    }
    ptr1 = ptr1 + 1;
    ptr2 = ptr2 + 1;
    lVar1 = lVar1 + -1;
  }
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(nameMatchesAscii)(const ENCODING *UNUSED_P(enc), const char *ptr1,
                         const char *end1, const char *ptr2)
{
  for (; *ptr2; ptr1 += MINBPC(enc), ptr2++) {
    if (end1 - ptr1 < MINBPC(enc))
      return 0;
    if (!CHAR_MATCHES(enc, ptr1, *ptr2))
      return 0;
  }
  return ptr1 == end1;
}